

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

LY_ERR lyd_parse_xml(ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,
                    ly_in *in,uint32_t parse_opts,uint32_t val_opts,uint32_t int_opts,ly_set *parsed
                    ,ly_bool *subtree_sibling,lyd_ctx **lydctx_p)

{
  LY_ERR LVar1;
  ly_err_item *plVar2;
  ly_err_item *__eitem_2;
  ly_err_item *__eitem_1;
  ly_err_item *__eitem;
  lyd_node *plStack_60;
  LYXML_PARSER_STATUS status;
  lyd_node *act;
  ly_bool close_elem;
  lyd_ctx *plStack_50;
  ly_bool parsed_data_nodes;
  lyd_xml_ctx *lydctx;
  LY_ERR local_40;
  LY_ERR rc;
  LY_ERR r;
  uint32_t parse_opts_local;
  ly_in *in_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lysc_ext_instance *ext_local;
  ly_ctx *ctx_local;
  
  lydctx._4_4_ = 0;
  act._7_1_ = '\0';
  act._6_1_ = '\0';
  plStack_60 = (lyd_node *)0x0;
  rc = parse_opts;
  _r = in;
  in_local = (ly_in *)first_p;
  first_p_local = (lyd_node **)parent;
  parent_local = (lyd_node *)ext;
  ext_local = (lysc_ext_instance *)ctx;
  if (((ctx == (ly_ctx *)0x0) || (in == (ly_in *)0x0)) || (lydctx_p == (lyd_ctx **)0x0)) {
    __assert_fail("ctx && in && lydctx_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x4e4,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((parse_opts & 0xffff) != 0) {
    __assert_fail("!(parse_opts & ~LYD_PARSE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x4e5,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((val_opts & 0xffff0000) != 0) {
    __assert_fail("!(val_opts & ~LYD_VALIDATE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x4e6,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  plStack_50 = (lyd_ctx *)calloc(1,0x1080);
  if (plStack_50 == (lyd_ctx *)0x0) {
    ly_log((ly_ctx *)ext_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_parse_xml");
    return LY_EMEM;
  }
  lydctx._4_4_ = lyxml_ctx_new((ly_ctx *)ext_local,_r,(lyxml_ctx **)&plStack_50->data_ctx);
  if (lydctx._4_4_ == LY_SUCCESS) {
    plStack_50->parse_opts = rc;
    plStack_50->val_opts = val_opts;
    plStack_50->int_opts = int_opts;
    plStack_50->free = lyd_xml_ctx_free;
    plStack_50->ext = (lysc_ext_instance *)parent_local;
    lydctx._4_4_ = lyd_parser_find_operation
                             ((lyd_node *)first_p_local,int_opts,&plStack_50->op_node);
    if (lydctx._4_4_ == LY_SUCCESS) {
      if ((((int_opts & 1) != 0) && ((int_opts & 2) != 0)) &&
         (LVar1 = lydxml_envelope((lyxml_ctx *)plStack_50->data_ctx,"action",
                                  "urn:ietf:params:xml:ns:yang:1",'\0',&stack0xffffffffffffffa0),
         LVar1 == LY_SUCCESS)) {
        act._6_1_ = '\x01';
        int_opts = int_opts & 0xfffffffe;
      }
      do {
        if (((lyxml_ctx *)plStack_50->data_ctx)->status != LYXML_ELEMENT) break;
        local_40 = lydxml_subtree_r((lyd_xml_ctx *)plStack_50,(lyd_node *)first_p_local,
                                    (lyd_node **)in_local,parsed);
        if ((local_40 != LY_SUCCESS) &&
           (((lydctx._4_4_ = local_40,
             plVar2 = ly_err_last(((lyxml_ctx *)plStack_50->data_ctx)->ctx), local_40 != LY_EVALID
             || (plStack_50 == (lyd_ctx *)0x0)) ||
            (((plStack_50->val_opts & 4) == 0 || (plVar2->vecode == LYVE_SYNTAX))))))
        goto LAB_00147c2b;
        act._7_1_ = '\x01';
      } while ((int_opts & 0x20) != 0);
      if (act._6_1_ != '\0') {
        if (((lyxml_ctx *)plStack_50->data_ctx)->status != LYXML_ELEM_CLOSE) {
          if (((lyxml_ctx *)plStack_50->data_ctx)->status != LYXML_ELEMENT) {
            __assert_fail("lydctx->xmlctx->status == LYXML_ELEMENT",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                          ,0x50c,
                          "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                         );
          }
          ly_vlog(((lyxml_ctx *)plStack_50->data_ctx)->ctx,(char *)0x0,LYVE_SYNTAX,
                  "Unexpected child element \"%.*s\".",
                  (((lyxml_ctx *)plStack_50->data_ctx)->field_6).name_len & 0xffffffff,
                  (((lyxml_ctx *)plStack_50->data_ctx)->field_5).name);
          lydctx._4_4_ = LY_EVALID;
          goto LAB_00147c2b;
        }
        lydctx._4_4_ = lyxml_ctx_next((lyxml_ctx *)plStack_50->data_ctx);
        if (lydctx._4_4_ != LY_SUCCESS) goto LAB_00147c2b;
      }
      if (((int_opts & 0x40) != 0) && (((lyxml_ctx *)plStack_50->data_ctx)->status == LYXML_ELEMENT)
         ) {
        ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_SYNTAX,"Unexpected sibling node.");
        local_40 = LY_EVALID;
        lydctx._4_4_ = LY_EVALID;
        plVar2 = ly_err_last(((lyxml_ctx *)plStack_50->data_ctx)->ctx);
        if ((local_40 != LY_EVALID) ||
           (((plStack_50 == (lyd_ctx *)0x0 || ((plStack_50->val_opts & 4) == 0)) ||
            (plVar2->vecode == LYVE_SYNTAX)))) goto LAB_00147c2b;
      }
      if (((int_opts & 0xf) != 0) && (plStack_50->op_node == (lyd_node *)0x0)) {
        ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_DATA,"Missing the operation node.");
        local_40 = LY_EVALID;
        lydctx._4_4_ = LY_EVALID;
        plVar2 = ly_err_last(((lyxml_ctx *)plStack_50->data_ctx)->ctx);
        if ((local_40 != LY_EVALID) ||
           (((plStack_50 == (lyd_ctx *)0x0 || ((plStack_50->val_opts & 4) == 0)) ||
            (plVar2->vecode == LYVE_SYNTAX)))) goto LAB_00147c2b;
      }
      if (act._7_1_ == '\0') {
        plStack_50->op_node = (lyd_node *)0x0;
      }
      if ((rc & 0x400000) != LY_SUCCESS) {
        if (subtree_sibling == (ly_bool *)0x0) {
          __assert_fail("subtree_sibling",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x529,
                        "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                       );
        }
        LVar1 = lyxml_ctx_peek((lyxml_ctx *)plStack_50->data_ctx,
                               (LYXML_PARSER_STATUS *)((long)&__eitem + 4));
        if ((LVar1 == LY_SUCCESS) && (__eitem._4_4_ == 0)) {
          *subtree_sibling = '\x01';
        }
        else {
          *subtree_sibling = '\0';
        }
      }
    }
  }
LAB_00147c2b:
  if (((rc & 0x10000) != LY_SUCCESS) &&
     ((((plStack_50->node_types).count != 0 || ((plStack_50->meta_types).count != 0)) ||
      ((plStack_50->node_when).count != 0)))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x534,
                  "LY_ERR lyd_parse_xml(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  lyd_free_tree(plStack_60);
  if ((lydctx._4_4_ == LY_SUCCESS) ||
     (((plStack_50->val_opts & 4) != 0 && (lydctx._4_4_ == LY_EVALID)))) {
    *lydctx_p = plStack_50;
    lyxml_ctx_free((lyxml_ctx *)plStack_50->data_ctx);
    plStack_50->data_ctx = (anon_struct_24_3_37108ca1 *)0x0;
  }
  else {
    lyd_xml_ctx_free(plStack_50);
  }
  return lydctx._4_4_;
}

Assistant:

LY_ERR
lyd_parse_xml(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, uint32_t int_opts,
        struct ly_set *parsed, ly_bool *subtree_sibling, struct lyd_ctx **lydctx_p)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_xml_ctx *lydctx;
    ly_bool parsed_data_nodes = 0, close_elem = 0;
    struct lyd_node *act = NULL;
    enum LYXML_PARSER_STATUS status;

    assert(ctx && in && lydctx_p);
    assert(!(parse_opts & ~LYD_PARSE_OPTS_MASK));
    assert(!(val_opts & ~LYD_VALIDATE_OPTS_MASK));

    /* init context */
    lydctx = calloc(1, sizeof *lydctx);
    LY_CHECK_ERR_RET(!lydctx, LOGMEM(ctx), LY_EMEM);
    LY_CHECK_GOTO(rc = lyxml_ctx_new(ctx, in, &lydctx->xmlctx), cleanup);
    lydctx->parse_opts = parse_opts;
    lydctx->val_opts = val_opts;
    lydctx->int_opts = int_opts;
    lydctx->free = lyd_xml_ctx_free;
    lydctx->ext = ext;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    if ((int_opts & LYD_INTOPT_RPC) && (int_opts & LYD_INTOPT_ACTION)) {
        /* can be either, try to parse "action" */
        if (!lydxml_envelope(lydctx->xmlctx, "action", "urn:ietf:params:xml:ns:yang:1", 0, &act)) {
            close_elem = 1;
            int_opts &= ~LYD_INTOPT_RPC;
        }
    }

    /* parse XML data */
    while (lydctx->xmlctx->status == LYXML_ELEMENT) {
        r = lydxml_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

        parsed_data_nodes = 1;

        if (!(int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    }

    /* close an opened element */
    if (close_elem) {
        if (lydctx->xmlctx->status != LYXML_ELEM_CLOSE) {
            assert(lydctx->xmlctx->status == LYXML_ELEMENT);
            LOGVAL(lydctx->xmlctx->ctx, LYVE_SYNTAX, "Unexpected child element \"%.*s\".",
                    (int)lydctx->xmlctx->name_len, lydctx->xmlctx->name);
            rc = LY_EVALID;
            goto cleanup;
        }

        LY_CHECK_GOTO(rc = lyxml_ctx_next(lydctx->xmlctx), cleanup);
    }

    /* check final state */
    if ((int_opts & LYD_INTOPT_NO_SIBLINGS) && (lydctx->xmlctx->status == LYXML_ELEMENT)) {
        LOGVAL(ctx, LYVE_SYNTAX, "Unexpected sibling node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

    if (!parsed_data_nodes) {
        /* no data nodes were parsed */
        lydctx->op_node = NULL;
    }

    if (parse_opts & LYD_PARSE_SUBTREE) {
        /* check for a sibling element */
        assert(subtree_sibling);
        if (!lyxml_ctx_peek(lydctx->xmlctx, &status) && (status == LYXML_ELEMENT)) {
            *subtree_sibling = 1;
        } else {
            *subtree_sibling = 0;
        }
    }

cleanup:
    /* there should be no unres stored if validation should be skipped */
    assert(!(parse_opts & LYD_PARSE_ONLY) || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    lyd_free_tree(act);
    if (rc && (!(lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) || (rc != LY_EVALID))) {
        lyd_xml_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the XML context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyxml_ctx_free(lydctx->xmlctx);
        lydctx->xmlctx = NULL;
    }
    return rc;
}